

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QRingChunk>::emplace<QRingChunk>
          (QMovableArrayOps<QRingChunk> *this,qsizetype i,QRingChunk *args)

{
  QRingChunk **ppQVar1;
  QRingChunk *pQVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  QRingChunk *pQVar10;
  qsizetype *pqVar11;
  bool bVar12;
  
  pDVar3 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0012f83e:
    pDVar5 = (args->chunk).d.d;
    pcVar6 = (args->chunk).d.ptr;
    (args->chunk).d.d = (Data *)0x0;
    (args->chunk).d.ptr = (char *)0x0;
    qVar7 = (args->chunk).d.size;
    (args->chunk).d.size = 0;
    qVar8 = args->headOffset;
    qVar9 = args->tailOffset;
    bVar12 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size !=
             0;
    QArrayDataPointer<QRingChunk>::detachAndGrow
              ((QArrayDataPointer<QRingChunk> *)this,(uint)(i == 0 && bVar12),1,(QRingChunk **)0x0,
               (QArrayDataPointer<QRingChunk> *)0x0);
    pQVar10 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
    if (i != 0 || !bVar12) {
      pQVar2 = pQVar10 + i;
      memmove(pQVar2 + 1,pQVar10 + i,
              ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size -
              i) * 0x28);
      (pQVar2->chunk).d.d = pDVar5;
      (pQVar2->chunk).d.ptr = pcVar6;
      (pQVar2->chunk).d.size = qVar7;
      pQVar2->headOffset = qVar8;
      pQVar2->tailOffset = qVar9;
      goto LAB_0012f913;
    }
    pQVar10[-1].chunk.d.d = pDVar5;
    pQVar10[-1].chunk.d.ptr = pcVar6;
    pQVar10[-1].chunk.d.size = qVar7;
    pQVar10[-1].headOffset = qVar8;
    pQVar10[-1].tailOffset = qVar9;
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>
                      .ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pQVar10 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
      pDVar5 = (args->chunk).d.d;
      (args->chunk).d.d = (Data *)0x0;
      pQVar10[lVar4].chunk.d.d = pDVar5;
      pcVar6 = (args->chunk).d.ptr;
      (args->chunk).d.ptr = (char *)0x0;
      pQVar10[lVar4].chunk.d.ptr = pcVar6;
      qVar7 = (args->chunk).d.size;
      (args->chunk).d.size = 0;
      pQVar10[lVar4].chunk.d.size = qVar7;
      qVar7 = args->tailOffset;
      pQVar10[lVar4].headOffset = args->headOffset;
      (&pQVar10[lVar4].headOffset)[1] = qVar7;
      goto LAB_0012f913;
    }
    if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
       ((QRingChunk *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
        == (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr))
    goto LAB_0012f83e;
    pQVar10 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
    pDVar5 = (args->chunk).d.d;
    (args->chunk).d.d = (Data *)0x0;
    pQVar10[-1].chunk.d.d = pDVar5;
    pcVar6 = (args->chunk).d.ptr;
    (args->chunk).d.ptr = (char *)0x0;
    pQVar10[-1].chunk.d.ptr = pcVar6;
    qVar7 = (args->chunk).d.size;
    (args->chunk).d.size = 0;
    pQVar10[-1].chunk.d.size = qVar7;
    qVar7 = args->tailOffset;
    pQVar10[-1].headOffset = args->headOffset;
    pQVar10[-1].tailOffset = qVar7;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0012f913:
  pqVar11 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size;
  *pqVar11 = *pqVar11 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }